

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

bool __thiscall
ON_PostEffect::SetParameter(ON_PostEffect *this,wchar_t *param_name,ON_XMLVariant *param_value)

{
  bool bVar1;
  int iVar2;
  ON_XMLNode *pOVar3;
  undefined4 extraout_var;
  undefined1 local_140 [8];
  ON_XMLVariant current_value;
  ON_XMLParameters p;
  ON_XMLNode *pep_param_node;
  ON_XMLNode *pep_node;
  ON_XMLVariant *param_value_local;
  wchar_t *param_name_local;
  ON_PostEffect *this_local;
  
  pOVar3 = CImpl::PepNode(this->_impl);
  if (pOVar3 == (ON_XMLNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = (*pOVar3->_vptr_ON_XMLNode[0x25])(pOVar3,L"state");
    if ((ON_XMLNode *)CONCAT44(extraout_var,iVar2) == (ON_XMLNode *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      ON_XMLParameters::ON_XMLParameters
                ((ON_XMLParameters *)(current_value._PRIVATE + 0xe0),
                 (ON_XMLNode *)CONCAT44(extraout_var,iVar2));
      ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)local_140);
      bVar1 = ON_XMLParameters::GetParam
                        ((ON_XMLParameters *)(current_value._PRIVATE + 0xe0),param_name,
                         (ON_XMLVariant *)local_140);
      if (bVar1) {
        pOVar3 = ON_XMLParameters::SetParam
                           ((ON_XMLParameters *)(current_value._PRIVATE + 0xe0),param_name,
                            param_value);
        if (pOVar3 == (ON_XMLNode *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)local_140);
      ON_XMLParameters::~ON_XMLParameters((ON_XMLParameters *)(current_value._PRIVATE + 0xe0));
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PostEffect::SetParameter(const wchar_t* param_name, const ON_XMLVariant& param_value)
{
  const ON_XMLNode* pep_node = _impl->PepNode();
  if (nullptr == pep_node)
    return false;

  ON_XMLNode* pep_param_node = pep_node->GetNamedChild(ON_RDK_PEP_PARAMS);
  if (nullptr == pep_param_node)
    return false;

  ON_XMLParameters p(*pep_param_node);

  ON_XMLVariant current_value;
  if (!p.GetParam(param_name, current_value))
    return false; // If you can't get it, you can't set it.

  if (!p.SetParam(param_name, param_value))
    return false;

  return true;
}